

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O2

int_t mc64sd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *numx,int_t *w,
             int_t *len,int_t *lenl,int_t *lenh,int_t *fc,int_t *iw,int_t *iw4)

{
  int_t *piVar1;
  int_t *piVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int local_a4;
  int_t nval;
  uint local_9c;
  double local_98;
  double local_90;
  int_t *local_88;
  double local_80;
  int_t cnt;
  int_t mod;
  ulong local_70;
  double local_68;
  int *local_60;
  int local_54;
  int local_50;
  int local_4c;
  int *local_48;
  int_t *local_40;
  double local_38;
  
  piVar1 = iw + -1;
  local_88 = w + -1;
  local_60 = iperm;
  local_48 = ne;
  local_98 = dmach("Overflow");
  uVar3 = 0;
  if (0 < *n) {
    uVar3 = (ulong)(uint)*n;
  }
  for (lVar6 = 1; lVar6 - uVar3 != 1; lVar6 = lVar6 + 1) {
    fc[lVar6 + -1] = (int_t)lVar6;
    iw[lVar6 + -1] = 0;
    len[lVar6 + -1] = ip[lVar6] - ip[lVar6 + -1];
  }
  cnt = 1;
  *numx = 0;
  iVar10 = *n;
  mod = cnt;
  mc64ud_(&cnt,&mod,n,irn,iw4 + iVar10,ip,len,fc,iw,numx,n,iw4,iw4 + iVar10,
          iw4 + (long)(int)(iVar10 * 2 | 1) + -1,iw4 + (long)iVar10 * 3);
  local_9c = *numx;
  uVar13 = *n;
  dVar15 = local_98;
  if (local_9c == uVar13) {
    uVar4 = 0;
    if (0 < (int)local_9c) {
      uVar4 = local_9c;
    }
    uVar3 = 1;
    while (dVar17 = dVar15, uVar3 != uVar4 + 1) {
      uVar8 = uVar3 + 1;
      dVar15 = 0.0;
      for (lVar6 = (long)ip[uVar3 - 1]; lVar6 < ip[uVar3]; lVar6 = lVar6 + 1) {
        dVar16 = a[lVar6 + -1];
        if (a[lVar6 + -1] <= dVar15) {
          dVar16 = dVar15;
        }
        dVar15 = dVar16;
      }
      uVar3 = uVar8;
      if (dVar17 <= dVar15) {
        dVar15 = dVar17;
      }
    }
    dVar15 = dVar17 * 1.0010000467300415;
  }
  local_68 = 0.0;
  local_40 = iw4 + -1;
  if ((int)uVar13 < 1) {
    uVar13 = 0;
  }
  uVar3 = 1;
  uVar8 = 0;
  while (uVar7 = uVar3, local_a4 = (int)uVar8, uVar7 != uVar13 + 1) {
    iVar9 = ip[uVar7] - ip[uVar7 - 1];
    lenh[uVar7 - 1] = iVar9;
    len[uVar7 - 1] = iVar9;
    iVar10 = ip[uVar7];
    for (lVar6 = (long)ip[uVar7 - 1]; lVar6 < iVar10; lVar6 = lVar6 + 1) {
      if (a[lVar6 + -1] <= dVar15 && dVar15 != a[lVar6 + -1]) {
        iVar10 = (int)lVar6;
        break;
      }
    }
    iVar10 = iVar10 - ip[uVar7 - 1];
    lenl[uVar7 - 1] = iVar10;
    uVar3 = uVar7 + 1;
    if (iVar10 != iVar9) {
      local_88[uVar8 + 1] = (int_t)uVar7;
      uVar8 = (ulong)(local_a4 + 1);
    }
  }
  local_54 = *local_48;
  if (local_54 < 1) {
    local_54 = 0;
  }
  local_54 = local_54 + 1;
  local_80 = 0.0;
  dVar17 = 0.0;
  local_50 = 1;
  while (local_50 != local_54) {
    local_70 = (ulong)local_9c;
    if (local_9c == *numx) {
      uVar3 = (ulong)(uint)*n;
      if (*n < 1) {
        uVar3 = 0;
      }
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        local_60[uVar7] = iw[uVar7];
      }
      local_4c = *local_48;
      if (local_4c < 1) {
        local_4c = 0;
      }
      local_4c = local_4c + 1;
      iVar10 = 1;
      dVar16 = local_80;
      local_98 = dVar15;
      do {
        if (iVar10 == local_4c) break;
        local_80 = (double)CONCAT44(local_80._4_4_,iVar10);
        if (((local_98 == dVar17) && (!NAN(local_98) && !NAN(dVar17))) ||
           (local_38 = dVar17, mc64qd_(ip,lenl,len,w,&local_a4,a,&nval,&local_68), nval < 2))
        goto LAB_00112c6d;
        iVar10 = *n;
        local_90 = (double)CONCAT44(local_90._4_4_,iVar10);
        iVar9 = 1;
        iVar5 = 1;
        while ((local_a4 = (int)uVar8, iVar9 <= iVar10 && (iVar5 <= local_a4))) {
          iVar11 = local_88[iVar5];
          uVar3 = (long)lenl[(long)iVar11 + -1] + (long)ip[(long)iVar11 + -1];
          uVar13 = len[(long)iVar11 + -1] + ip[(long)iVar11 + -1];
          lVar6 = (long)(int)uVar13;
          uVar7 = uVar3 & 0xffffffff;
          if ((int)uVar13 < (int)uVar3) {
            uVar7 = (ulong)uVar13;
          }
          while (iVar12 = (int)uVar7, (long)uVar3 < lVar6) {
            if (local_68 <= a[lVar6 + -2]) {
              iVar12 = (int)lVar6;
              break;
            }
            lVar14 = lVar6 + -2;
            lVar6 = lVar6 + -1;
            if (piVar1[irn[lVar14]] == iVar11) {
              piVar1[irn[lVar14]] = 0;
              local_70 = (long)(int)local_70 - 1;
              fc[((long)*n - local_70) + -1] = iVar11;
            }
          }
          lenh[(long)iVar11 + -1] = len[(long)iVar11 + -1];
          len[(long)iVar11 + -1] = iVar12 - ip[(long)iVar11 + -1];
          if (lenl[(long)iVar11 + -1] == lenh[(long)iVar11 + -1]) {
            local_88[iVar5] = local_88[local_a4];
            uVar8 = (ulong)(local_a4 - 1);
          }
          else {
            iVar5 = iVar5 + 1;
          }
          iVar9 = iVar9 + 1;
        }
        iVar10 = local_80._0_4_ + 1;
        dVar16 = local_38;
        dVar17 = local_68;
      } while (*numx <= (int)local_70);
      local_9c = (uint)local_70;
      mod = 1;
      local_90 = dVar17;
      local_80 = dVar16;
    }
    else {
      local_90 = dVar17;
      mc64qd_(ip,len,lenh,w,&local_a4,a,&nval,&local_68);
      if (nval == 0) break;
      if ((local_68 == local_80) && (!NAN(local_68) && !NAN(local_80))) break;
      iVar10 = *n;
      iVar9 = 1;
      iVar5 = 1;
      while ((local_a4 = (int)uVar8, iVar9 <= iVar10 && (iVar5 <= local_a4))) {
        lVar6 = (long)local_88[iVar5];
        uVar3 = (long)lenh[lVar6 + -1] + (long)ip[lVar6 + -1];
        uVar13 = ip[lVar6 + -1] + len[lVar6 + -1];
        lVar14 = (long)(int)uVar13;
        uVar7 = uVar3 & 0xffffffff;
        if ((int)uVar3 < (int)uVar13) {
          uVar7 = (ulong)uVar13;
        }
        for (; iVar11 = (int)uVar7, lVar14 < (long)uVar3; lVar14 = lVar14 + 1) {
          if (a[lVar14 + -1] <= local_68 && local_68 != a[lVar14 + -1]) {
            iVar11 = (int)lVar14;
            break;
          }
        }
        lenl[lVar6 + -1] = len[lVar6 + -1];
        len[lVar6 + -1] = iVar11 - ip[lVar6 + -1];
        if (lenl[lVar6 + -1] == lenh[lVar6 + -1]) {
          local_88[iVar5] = local_88[local_a4];
          uVar8 = (ulong)(local_a4 - 1);
        }
        else {
          iVar5 = iVar5 + 1;
        }
        iVar9 = iVar9 + 1;
      }
      mod = 0;
      local_98 = local_90;
      local_90 = local_68;
    }
    iVar9 = local_50 + 1;
    iVar10 = *n;
    cnt = iVar9;
    mc64ud_(&cnt,&mod,n,irn,iw4 + iVar10,ip,len,fc,iw,(int_t *)&local_9c,numx,iw4,iw4 + iVar10,
            local_40 + (iVar10 * 2 + 1),iw4 + (long)iVar10 * 3);
    dVar17 = local_90;
    dVar15 = local_98;
    local_50 = iVar9;
  }
LAB_00112c6d:
  uVar13 = *n;
  if (*numx != uVar13) {
    uVar8 = 0;
    uVar3 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar3 = uVar8;
    }
    for (; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      w[uVar8] = 0;
    }
    uVar8 = 0;
    uVar3 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar3 = uVar8;
    }
    iVar10 = 0;
    while (uVar3 != uVar8) {
      iVar5 = iVar10 + 1;
      piVar2 = local_88;
      iVar9 = local_60[uVar8];
      if (local_60[uVar8] == 0) {
        iVar10 = iVar5;
        piVar2 = piVar1;
        iVar9 = iVar5;
      }
      uVar8 = uVar8 + 1;
      piVar2[iVar9] = (int_t)uVar8;
    }
    uVar8 = 0;
    uVar3 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar3 = uVar8;
    }
    iVar10 = 0;
    for (; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      if (w[uVar8] == 0) {
        lVar6 = (long)iVar10;
        iVar10 = iVar10 + 1;
        local_60[(long)iw[lVar6] + -1] = (int)uVar8 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int_t mc64sd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *numx, int_t *w, 
	int_t *len, int_t *lenl, int_t *lenh, int_t *fc, int_t *iw, 
	int_t *iw4)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, i__4;

    /* Local variables */
    int_t i__, j, k, l, ii, mod, cnt, num;
    double bval, bmin, bmax, rinf;
    int_t nval, wlen, idum1, idum2, idum3;
    extern /* Subroutine */ int_t
	mc64qd_(int_t *, int_t *, int_t *, int_t *, int_t *, double *,
		int_t *, double *), 
	mc64ud_(int_t *, int_t *, int_t *, int_t *, int_t *, 
		int_t *, int_t *, int_t *, int_t *, int_t *, int_t *, 
		int_t *, int_t *, int_t *, int_t *);

/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN, are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   A(K), K=1..NE, must be set to the value of the entry that */
/*   corresponds to IRN(k). The entries in each column must be */
/*   non-negative and ordered by decreasing value. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*   bottleneck matching: IPERM(I) - 0 or row I is matched to column */
/*   IPERM(I). */
/* NUMX is an INT_T variable. On exit, it contains the cardinality */
/*   of the matching stored in IPERM. */
/* IW is an INT_T work array of length 10N. */
/* FC is an int_t array of length N that contains the list of */
/*   unmatched columns. */
/* LEN(J), LENL(J), LENH(J) are int_t arrays of length N that point */
/*   to entries in matrix column J. */
/*   In the matrix defined by the column parts IP(J)+LENL(J) we know */
/*   a matching does not exist; in the matrix defined by the column */
/*   parts IP(J)+LENH(J) we know one exists. */
/*   LEN(J) lies between LENL(J) and LENH(J) and determines the matrix */
/*   that is tested for a maximum matching. */
/* W is an int_t array of length N and contains the indices of the */
/*   columns for which LENL ne LENH. */
/* WLEN is number of indices stored in array W. */
/* IW is int_t work array of length N. */
/* IW4 is int_t work array of length 4N used by MC64U/UD. */
/*      EXTERNAL FD05AD,MC64QD,MC64UD */
/*      DOUBLE PRECISION FD05AD */
/* BMIN and BMAX are such that a maximum matching exists for the input */
/*   matrix in which all entries smaller than BMIN are dropped. */
/*   For BMAX, a maximum matching does not exist. */
/* BVAL is a value between BMIN and BMAX. */
/* CNT is the number of calls made to MC64U/UD so far. */
/* NUM is the cardinality of last matching found. */
/* Set RINF to largest positive real number */
/* XSL      RINF = FD05AD(5) */
    /* Parameter adjustments */
    --iw4;
    --iw;
    --fc;
    --lenh;
    --lenl;
    --len;
    --w;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Compute a first maximum matching from scratch on whole matrix. */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	fc[j] = j;
	iw[j] = 0;
	len[j] = ip[j + 1] - ip[j];
/* L20: */
    }
/* The first call to MC64U/UD */
    cnt = 1;
    mod = 1;
    *numx = 0;
    mc64ud_(&cnt, &mod, n, &irn[1], ne, &ip[1], &len[1], &fc[1], &iw[1], numx,
	     n, &iw4[1], &iw4[*n + 1], &iw4[(*n << 1) + 1], &iw4[*n * 3 + 1]);
/* IW contains a maximum matching of length NUMX. */
    num = *numx;
    if (num != *n) {
/* Matrix is structurally singular */
	bmax = rinf;
    } else {
/* Matrix is structurally nonsingular, NUM=NUMX=N; */
/* Set BMAX just above the smallest of all the maximum absolute */
/* values of the columns */
	bmax = rinf;
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    bval = 0.f;
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		if (a[k] > bval) {
		    bval = a[k];
		}
/* L25: */
	    }
	    if (bval < bmax) {
		bmax = bval;
	    }
/* L30: */
	}
	bmax *= 1.001f;
    }
/* Initialize BVAL,BMIN */
    bval = 0.f;
    bmin = 0.f;
/* Initialize LENL,LEN,LENH,W,WLEN according to BMAX. */
/* Set LEN(J), LENH(J) just after last entry in column J. */
/* Set LENL(J) just after last entry in column J with value ge BMAX. */
    wlen = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ip[j + 1] - ip[j];
	lenh[j] = l;
	len[j] = l;
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    if (a[k] < bmax) {
		goto L46;
	    }
/* L45: */
	}
/* Column J is empty or all entries are ge BMAX */
	k = ip[j + 1];
L46:
	lenl[j] = k - ip[j];
/* Add J to W if LENL(J) ne LENH(J) */
	if (lenl[j] == l) {
	    goto L48;
	}
	++wlen;
	w[wlen] = j;
L48:
	;
    }
/* Main loop */
    i__1 = *ne;
    for (idum1 = 1; idum1 <= i__1; ++idum1) {
	if (num == *numx) {
/* We have a maximum matching in IW; store IW in IPERM */
	    i__2 = *n;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		iperm[i__] = iw[i__];
/* L50: */
	    }
/* Keep going round this loop until matching IW is no longer maximum. */
	    i__2 = *ne;
	    for (idum2 = 1; idum2 <= i__2; ++idum2) {
		bmin = bval;
		if (bmax == bmin) {
		    goto L99;
		}
/* Find splitting value BVAL */
		mc64qd_(&ip[1], &lenl[1], &len[1], &w[1], &wlen, &a[1], &nval,
			 &bval);
		if (nval <= 1) {
		    goto L99;
		}
/* Set LEN such that all matrix entries with value lt BVAL are */
/* discarded. Store old LEN in LENH. Do this for all columns W(K). */
/* Each step, either K is incremented or WLEN is decremented. */
		k = 1;
		i__3 = *n;
		for (idum3 = 1; idum3 <= i__3; ++idum3) {
		    if (k > wlen) {
			goto L71;
		    }
		    j = w[k];
		    i__4 = ip[j] + lenl[j];
		    for (ii = ip[j] + len[j] - 1; ii >= i__4; --ii) {
			if (a[ii] >= bval) {
			    goto L60;
			}
			i__ = irn[ii];
			if (iw[i__] != j) {
			    goto L55;
			}
/* Remove entry from matching */
			iw[i__] = 0;
			--num;
			fc[*n - num] = j;
L55:
			;
		    }
L60:
		    lenh[j] = len[j];
/* IP(J)+LEN(J)-1 is last entry in column ge BVAL */
		    len[j] = ii - ip[j] + 1;
/* If LENH(J) = LENL(J), remove J from W */
		    if (lenl[j] == lenh[j]) {
			w[k] = w[wlen];
			--wlen;
		    } else {
			++k;
		    }
/* L70: */
		}
L71:
		if (num < *numx) {
		    goto L81;
		}
/* L80: */
	    }
/* End of dummy loop; this point is never reached */
/* Set mode for next call to MC64U/UD */
L81:
	    mod = 1;
	} else {
/* We do not have a maximum matching in IW. */
	    bmax = bval;
/* BMIN is the bottleneck value of a maximum matching; */
/* for BMAX the matching is not maximum, so BMAX>BMIN */
/*          IF (BMAX .EQ. BMIN) GO TO 99 */
/* Find splitting value BVAL */
	    mc64qd_(&ip[1], &len[1], &lenh[1], &w[1], &wlen, &a[1], &nval, &
		    bval);
	    if (nval == 0 || bval == bmin) {
		goto L99;
	    }
/* Set LEN such that all matrix entries with value ge BVAL are */
/* inside matrix. Store old LEN in LENL. Do this for all columns W(K). */
/* Each step, either K is incremented or WLEN is decremented. */
	    k = 1;
	    i__2 = *n;
	    for (idum3 = 1; idum3 <= i__2; ++idum3) {
		if (k > wlen) {
		    goto L88;
		}
		j = w[k];
		i__3 = ip[j] + lenh[j] - 1;
		for (ii = ip[j] + len[j]; ii <= i__3; ++ii) {
		    if (a[ii] < bval) {
			goto L86;
		    }
/* L85: */
		}
L86:
		lenl[j] = len[j];
		len[j] = ii - ip[j];
		if (lenl[j] == lenh[j]) {
		    w[k] = w[wlen];
		    --wlen;
		} else {
		    ++k;
		}
/* L87: */
	    }
/* End of dummy loop; this point is never reached */
/* Set mode for next call to MC64U/UD */
L88:
	    mod = 0;
	}
	++cnt;
	mc64ud_(&cnt, &mod, n, &irn[1], ne, &ip[1], &len[1], &fc[1], &iw[1], &
		num, numx, &iw4[1], &iw4[*n + 1], &iw4[(*n << 1) + 1], &iw4[*
		n * 3 + 1]);
/* IW contains maximum matching of length NUM */
/* L90: */
    }
/* End of dummy loop; this point is never reached */
/* BMIN is bottleneck value of final matching */
L99:
    if (*numx == *n) {
	goto L1000;
    }
/* The matrix is structurally singular, complete IPERM */
/* W, IW are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	w[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    iw[k] = i__;
	} else {
	    j = iperm[i__];
	    w[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (w[j] != 0) {
	    goto L320;
	}
	++k;
	idum1 = iw[k];
	iperm[idum1] = j;
L320:
	;
    }
L1000:
    return 0;
}